

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O3

void __thiscall
MinVR::VRDisplayNode::createChildren
          (VRDisplayNode *this,VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  int iVar1;
  undefined4 extraout_var;
  VRDisplayNode *pVVar2;
  _List_node_base *p_Var3;
  string validatedNameSpace;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  VRDataIndex::validateNameSpace(&local_68,config,nameSpace);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"displaynodeType","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"*","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,local_68._M_dataplus._M_p,
             local_68._M_dataplus._M_p + local_68._M_string_length);
  VRDataIndex::selectByAttribute((VRContainer *)&local_48,config,&local_c8,&local_88,&local_a8,true)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  p_Var3 = local_48._M_impl._M_node.super__List_node_base._M_next;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    p_Var3 = local_48._M_impl._M_node.super__List_node_base._M_next;
  }
  for (; p_Var3 != (_List_node_base *)&local_48;
      p_Var3 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    iVar1 = VRDataIndex::isChild(nameSpace,(string *)(p_Var3 + 1));
    if (iVar1 == 1) {
      iVar1 = (*vrMain->_vptr_VRMainInterface[7])(vrMain);
      pVVar2 = VRFactory::create<MinVR::VRDisplayNode>
                         ((VRFactory *)CONCAT44(extraout_var,iVar1),vrMain,config,
                          (string *)(p_Var3 + 1));
      if (pVVar2 != (VRDisplayNode *)0x0) {
        (*this->_vptr_VRDisplayNode[8])(this,pVVar2);
      }
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VRDisplayNode::createChildren(VRMainInterface *vrMain,
                                   VRDataIndex *config,
                                   const std::string &nameSpace) {

  std::string validatedNameSpace = config->validateNameSpace(nameSpace);

  std::list<std::string> names =
    config->selectByAttribute("displaynodeType", "*", validatedNameSpace, true);

  for (std::list<std::string>::const_iterator it = names.begin();
       it != names.end(); ++it) {

    // We only want to do this for direct children. The grandchildren
    // and their progeny will be addressed in turn.
    if (VRDataIndex::isChild(nameSpace, *it) == 1) {

      VRDisplayNode *child =
        vrMain->getFactory()->create<VRDisplayNode>(vrMain, config, *it);
      if (child != NULL) {
        addChild(child);
      }
    }
  }
}